

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

optional<bool> __thiscall
node::anon_unknown_2::ChainImpl::blockFilterMatchesAny
          (ChainImpl *this,BlockFilterType filter_type,uint256 *block_hash,ElementSet *filter_set)

{
  bool bVar1;
  _Optional_payload_base<bool> _Var2;
  BlockFilterIndex *this_00;
  ChainstateManager *pCVar3;
  CBlockIndex *block_index;
  ushort uVar4;
  ushort uVar5;
  long in_FS_OFFSET;
  BlockFilter filter;
  BlockFilterType in_stack_ffffffffffffff5f;
  BlockFilter local_98;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = GetBlockFilterIndex(in_stack_ffffffffffffff5f);
  if (this_00 == (BlockFilterIndex *)0x0) {
    _Var2._M_payload = (_Storage<bool,_true>)0x0;
    _Var2._M_engaged = false;
    goto LAB_0022c0e6;
  }
  BlockFilter::BlockFilter(&local_98);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&stack0xffffffffffffff58,&cs_main,
             "::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
             ,0x24a,false);
  pCVar3 = chainman(this);
  block_index = BlockManager::LookupBlockIndex(&pCVar3->m_blockman,block_hash);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffff58);
  if (block_index == (CBlockIndex *)0x0) {
LAB_0022c0cc:
    uVar4 = 0;
    uVar5 = 0;
  }
  else {
    bVar1 = BlockFilterIndex::LookupFilter(this_00,block_index,&local_98);
    if (!bVar1) goto LAB_0022c0cc;
    bVar1 = GCSFilter::MatchAny(&local_98.m_filter,filter_set);
    uVar4 = (ushort)bVar1;
    uVar5 = 0x100;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_98.m_filter.m_encoded.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  _Var2 = (_Optional_payload_base<bool>)(uVar5 | uVar4);
LAB_0022c0e6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)_Var2;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<bool> blockFilterMatchesAny(BlockFilterType filter_type, const uint256& block_hash, const GCSFilter::ElementSet& filter_set) override
    {
        const BlockFilterIndex* block_filter_index{GetBlockFilterIndex(filter_type)};
        if (!block_filter_index) return std::nullopt;

        BlockFilter filter;
        const CBlockIndex* index{WITH_LOCK(::cs_main, return chainman().m_blockman.LookupBlockIndex(block_hash))};
        if (index == nullptr || !block_filter_index->LookupFilter(index, filter)) return std::nullopt;
        return filter.GetFilter().MatchAny(filter_set);
    }